

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token __thiscall slang::parsing::Lexer::lexApostrophe(Lexer *this)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool *args_1;
  logic_t *args;
  LiteralBase *args_00;
  ulong uVar4;
  Token TVar5;
  LiteralBase base;
  LiteralBase base_1;
  LiteralBase local_d;
  LiteralBase local_c;
  bool local_b;
  bool local_a;
  logic_t local_9;
  
  pbVar2 = (byte *)this->sourceBuffer;
  bVar1 = *pbVar2;
  uVar4 = (ulong)(bVar1 - 0x53);
  if (bVar1 - 0x53 < 0x28) {
    if ((0x100000001U >> (uVar4 & 0x3f) & 1) != 0) {
      this->sourceBuffer = (char *)(pbVar2 + 1);
      bVar3 = literalBaseFromChar(pbVar2[1],&local_d);
      if (bVar3) {
        this->sourceBuffer = this->sourceBuffer + 1;
      }
      else {
        local_d = Decimal;
      }
      args_1 = &local_a;
      local_a = true;
      args_00 = &local_d;
      goto LAB_003a86bc;
    }
    if ((0x2000000020U >> (uVar4 & 0x3f) & 1) != 0) {
      this->sourceBuffer = (char *)(pbVar2 + 1);
      args = (logic_t *)&logic_t::x;
LAB_003a8654:
      TVar5 = create<slang::logic_t_const&>(this,UnbasedUnsizedLiteral,args);
      return TVar5;
    }
    if ((0x8000000080U >> (uVar4 & 0x3f) & 1) != 0) {
      this->sourceBuffer = (char *)(pbVar2 + 1);
      args = (logic_t *)&logic_t::z;
      goto LAB_003a8654;
    }
  }
  if (bVar1 - 0x30 < 2) {
    this->sourceBuffer = (char *)(pbVar2 + 1);
    local_9.value = bVar1 - 0x30;
    TVar5 = create<slang::logic_t>(this,UnbasedUnsizedLiteral,&local_9);
    return TVar5;
  }
  bVar3 = literalBaseFromChar(*pbVar2,&local_c);
  if (!bVar3) {
    TVar5 = create<>(this,Apostrophe);
    return TVar5;
  }
  this->sourceBuffer = this->sourceBuffer + 1;
  args_1 = &local_b;
  local_b = false;
  args_00 = &local_c;
LAB_003a86bc:
  TVar5 = create<slang::LiteralBase&,bool>(this,IntegerBase,args_00,args_1);
  return TVar5;
}

Assistant:

Token Lexer::lexApostrophe() {
    char c = peek();
    switch (c) {
        case '0':
        case '1':
            advance();
            return create(TokenKind::UnbasedUnsizedLiteral, (logic_t)getDigitValue(c));
        case 'x':
        case 'X':
            advance();
            return create(TokenKind::UnbasedUnsizedLiteral, logic_t::x);
        case 'Z':
        case 'z':
            advance();
            return create(TokenKind::UnbasedUnsizedLiteral, logic_t::z);
        case 's':
        case 'S': {
            advance();
            LiteralBase base;
            if (!literalBaseFromChar(peek(), base))
                base = LiteralBase::Decimal;
            else
                advance();
            return create(TokenKind::IntegerBase, base, true);
        }
        default: {
            LiteralBase base;
            if (literalBaseFromChar(peek(), base)) {
                advance();
                return create(TokenKind::IntegerBase, base, false);
            }

            // otherwise just an apostrophe token
            return create(TokenKind::Apostrophe);
        }
    }
}